

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

ChebyshevExpansion *
ChebTools::ChebyshevExpansion::factoryf
          (ChebyshevExpansion *__return_storage_ptr__,size_t N,VectorXd *f,double xmin,double xmax)

{
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == N + 1)
  {
    this = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
           LMatrixLibrary::get((LMatrixLibrary *)l_matrix_library,N);
    local_a0._0_16_ =
         Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                   (this,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)f);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_c0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_a0);
    ChebyshevExpansion(__return_storage_ptr__,(vectype *)&local_c0,xmin,xmax);
    free(local_c0._M_dataplus._M_p);
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string
            (&local_60,
             (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows);
  std::operator+(&local_40,"Size of f [",&local_60);
  std::operator+(&local_a0,&local_40,"] does not equal N+1 with N of ");
  std::__cxx11::to_string(&local_80,N);
  std::operator+(&local_c0,&local_a0,&local_80);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_c0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::factoryf(const std::size_t N, const Eigen::VectorXd &f, const double xmin, const double xmax) {
        if (f.size() != N+1){
            throw std::invalid_argument("Size of f [" + std::to_string(f.size()) + "] does not equal N+1 with N of "+std::to_string(N));
        }
        // Step 3: Get coefficients for the L matrix from the library of coefficients
        const Eigen::MatrixXd &L = l_matrix_library.get(N);
        // Step 4: Obtain coefficients from vector - matrix product
        return ChebyshevExpansion(L*f, xmin, xmax);
    }